

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  float fVar1;
  ImGuiDockNode *node_00;
  ImDrawList *this;
  ImGuiDockNode *pIVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ImU32 col;
  ImGuiID IVar9;
  float *pfVar10;
  ImGuiDockNode **ppIVar11;
  float fVar12;
  ImRect IVar13;
  ImVector<ImGuiDockNode_*> *local_220;
  ImVector<ImGuiDockNode_*> *local_130;
  ImGuiDockNode *node_to_preserve;
  ImGuiDockNode *touching_node;
  int local_d0;
  int touching_node_n_2;
  int side_n;
  float min_size_1;
  float min_size_0;
  float cur_size_1;
  float cur_size_0;
  ImVec2 local_b4;
  int local_ac;
  ImVec2 IStack_a8;
  int touching_node_n_1;
  ImVec2 local_a0;
  int local_98;
  ImGuiID local_94;
  int touching_node_n;
  ImGuiID splitter_id;
  float resize_limits [2];
  float min_size;
  undefined1 local_78 [8];
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  ImGuiWindow *window;
  ImGuiDockNodeFlags no_resize_axis_flag;
  ImGuiDockNodeFlags merged_flags;
  ImRect bb;
  ImGuiAxis axis;
  ImGuiDockNode *child_1;
  ImGuiDockNode *child_0;
  ImGuiContext *g;
  ImGuiDockNode *node_local;
  
  bVar6 = ImGuiDockNode::IsLeafNode(node);
  pIVar3 = GImGui;
  if (!bVar6) {
    node_00 = node->ChildNodes[0];
    unique0x00012000 = node->ChildNodes[1];
    if (((*(ushort *)&node_00->field_0xbc >> 9 & 1) != 0) &&
       ((*(ushort *)&unique0x00012000->field_0xbc >> 9 & 1) != 0)) {
      bb.Max.x = (float)node->SplitAxis;
      if (bb.Max.x == -NAN) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3b29,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      ImRect::ImRect((ImRect *)&no_resize_axis_flag);
      _no_resize_axis_flag = node_00->Pos;
      bb.Min = stack0xffffffffffffffd8->Pos;
      pfVar10 = ImVec2::operator[](&node_00->Size,(long)(int)bb.Max.x);
      fVar1 = *pfVar10;
      pfVar10 = ImVec2::operator[]((ImVec2 *)&no_resize_axis_flag,(long)(int)bb.Max.x);
      *pfVar10 = fVar1 + *pfVar10;
      pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Size,(long)(int)((uint)bb.Max.x ^ 1));
      fVar1 = *pfVar10;
      pfVar10 = ImVec2::operator[](&bb.Min,(long)(int)((uint)bb.Max.x ^ 1));
      *pfVar10 = fVar1 + *pfVar10;
      uVar7 = node_00->MergedFlags | stack0xffffffffffffffd8->MergedFlags;
      uVar8 = 0x800000;
      if (bb.Max.x == 0.0) {
        uVar8 = 0x400000;
      }
      if (((uVar7 & 0x20) == 0) && ((uVar7 & uVar8) == 0)) {
        PushID(node->ID);
        local_130 = (ImVector<ImGuiDockNode_*> *)local_78;
        do {
          ImVector<ImGuiDockNode_*>::ImVector(local_130);
          local_130 = local_130 + 1;
        } while (local_130 != (ImVector<ImGuiDockNode_*> *)&touching_nodes[1].Data);
        pfVar10 = ImVec2::operator[](&(pIVar3->Style).WindowMinSize,(long)(int)bb.Max.x);
        resize_limits[0] = *pfVar10;
        pfVar10 = ImVec2::operator[](&node->ChildNodes[0]->Pos,(long)(int)bb.Max.x);
        touching_node_n = (int)(*pfVar10 + resize_limits[0]);
        pfVar10 = ImVec2::operator[](&node->ChildNodes[1]->Pos,(long)(int)bb.Max.x);
        fVar1 = *pfVar10;
        pfVar10 = ImVec2::operator[](&node->ChildNodes[1]->Size,(long)(int)bb.Max.x);
        splitter_id = (ImGuiID)((fVar1 + *pfVar10) - resize_limits[0]);
        local_94 = GetID("##Splitter");
        if (pIVar3->ActiveId == local_94) {
          DockNodeTreeUpdateSplitterFindTouchingNode
                    (node_00,(ImGuiAxis)bb.Max.x,1,(ImVector<ImGuiDockNode_*> *)local_78);
          DockNodeTreeUpdateSplitterFindTouchingNode
                    (stack0xffffffffffffffd8,(ImGuiAxis)bb.Max.x,0,
                     (ImVector<ImGuiDockNode_*> *)&touching_nodes[0].Data);
          for (local_98 = 0; iVar5 = touching_node_n, local_98 < (int)local_78._0_4_;
              local_98 = local_98 + 1) {
            ppIVar11 = ImVector<ImGuiDockNode_*>::operator[]
                                 ((ImVector<ImGuiDockNode_*> *)local_78,local_98);
            IVar13 = ImGuiDockNode::Rect(*ppIVar11);
            local_a0 = IVar13.Max;
            IStack_a8 = IVar13.Min;
            pfVar10 = ImVec2::operator[](&stack0xffffffffffffff58,(long)(int)bb.Max.x);
            touching_node_n = (int)ImMax<float>((float)iVar5,*pfVar10 + resize_limits[0]);
          }
          for (local_ac = 0; IVar9 = splitter_id, local_ac < (int)touching_nodes[0].Data;
              local_ac = local_ac + 1) {
            ppIVar11 = ImVector<ImGuiDockNode_*>::operator[]
                                 ((ImVector<ImGuiDockNode_*> *)&touching_nodes[0].Data,local_ac);
            IVar13 = ImGuiDockNode::Rect(*ppIVar11);
            local_b4 = IVar13.Max;
            _cur_size_1 = IVar13.Min;
            pfVar10 = ImVec2::operator[](&local_b4,(long)(int)bb.Max.x);
            splitter_id = (ImGuiID)ImMin<float>((float)IVar9,*pfVar10 - resize_limits[0]);
          }
        }
        pfVar10 = ImVec2::operator[](&node_00->Size,(long)(int)bb.Max.x);
        min_size_0 = *pfVar10;
        pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Size,(long)(int)bb.Max.x);
        iVar5 = touching_node_n;
        min_size_1 = *pfVar10;
        pfVar10 = ImVec2::operator[](&node_00->Pos,(long)(int)bb.Max.x);
        fVar1 = *pfVar10;
        pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Pos,(long)(int)bb.Max.x);
        fVar12 = *pfVar10;
        pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Size,(long)(int)bb.Max.x);
        fVar12 = (fVar12 + *pfVar10) - (float)splitter_id;
        IVar9 = GetID("##Splitter");
        bVar6 = SplitterBehavior((ImRect *)&no_resize_axis_flag,IVar9,(ImGuiAxis)bb.Max.x,
                                 &min_size_0,&min_size_1,(float)iVar5 - fVar1,fVar12,4.0,0.04);
        fVar1 = min_size_0;
        if (((bVar6) && (0 < (int)local_78._0_4_)) && (0 < (int)touching_nodes[0].Data)) {
          pfVar10 = ImVec2::operator[](&node_00->SizeRef,(long)(int)bb.Max.x);
          *pfVar10 = fVar1;
          pfVar10 = ImVec2::operator[](&node_00->Size,(long)(int)bb.Max.x);
          fVar12 = min_size_1;
          *pfVar10 = fVar1;
          pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Size,(long)(int)bb.Max.x);
          fVar1 = *pfVar10;
          pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Pos,(long)(int)bb.Max.x);
          fVar4 = min_size_1;
          *pfVar10 = *pfVar10 - (fVar12 - fVar1);
          pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->SizeRef,(long)(int)bb.Max.x);
          *pfVar10 = fVar4;
          pfVar10 = ImVec2::operator[](&stack0xffffffffffffffd8->Size,(long)(int)bb.Max.x);
          *pfVar10 = fVar4;
          for (local_d0 = 0; local_d0 < 2; local_d0 = local_d0 + 1) {
            for (touching_node._4_4_ = 0;
                touching_node._4_4_ < *(int *)&touching_nodes[(long)local_d0 + -1].Data;
                touching_node._4_4_ = touching_node._4_4_ + 1) {
              ppIVar11 = ImVector<ImGuiDockNode_*>::operator[]
                                   ((ImVector<ImGuiDockNode_*> *)
                                    &touching_nodes[(long)local_d0 + -1].Data,touching_node._4_4_);
              for (node_to_preserve = *ppIVar11; node_to_preserve->ParentNode != node;
                  node_to_preserve = node_to_preserve->ParentNode) {
                if ((float)node_to_preserve->ParentNode->SplitAxis == bb.Max.x) {
                  pIVar2 = node_to_preserve->ParentNode->ChildNodes[local_d0];
                  *(ushort *)&pIVar2->field_0xbc = *(ushort *)&pIVar2->field_0xbc & 0x7fff | 0x8000;
                }
              }
            }
          }
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,false);
          DockNodeTreeUpdatePosSize
                    (stack0xffffffffffffffd8,stack0xffffffffffffffd8->Pos,
                     stack0xffffffffffffffd8->Size,false);
          MarkIniSettingsDirty();
        }
        PopID();
        local_220 = (ImVector<ImGuiDockNode_*> *)&touching_nodes[1].Data;
        do {
          local_220 = local_220 + -1;
          ImVector<ImGuiDockNode_*>::~ImVector(local_220);
        } while (local_220 != (ImVector<ImGuiDockNode_*> *)local_78);
      }
      else {
        this = pIVar3->CurrentWindow->DrawList;
        col = GetColorU32(0x1b,1.0);
        ImDrawList::AddRectFilled
                  (this,(ImVec2 *)&no_resize_axis_flag,&bb.Min,col,(pIVar3->Style).FrameRounding,0);
      }
    }
    if ((*(ushort *)&node_00->field_0xbc >> 9 & 1) != 0) {
      DockNodeTreeUpdateSplitter(node_00);
    }
    if ((*(ushort *)&stack0xffffffffffffffd8->field_0xbc >> 9 & 1) != 0) {
      DockNodeTreeUpdateSplitter(stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode* node)
{
    if (node->IsLeafNode())
        return;

    ImGuiContext& g = *GImGui;

    ImGuiDockNode* child_0 = node->ChildNodes[0];
    ImGuiDockNode* child_1 = node->ChildNodes[1];
    if (child_0->IsVisible && child_1->IsVisible)
    {
        // Bounding box of the splitter cover the space between both nodes (w = Spacing, h = Size[xy^1] for when splitting horizontally)
        const ImGuiAxis axis = (ImGuiAxis)node->SplitAxis;
        IM_ASSERT(axis != ImGuiAxis_None);
        ImRect bb;
        bb.Min = child_0->Pos;
        bb.Max = child_1->Pos;
        bb.Min[axis] += child_0->Size[axis];
        bb.Max[axis ^ 1] += child_1->Size[axis ^ 1];
        //if (g.IO.KeyCtrl) GetForegroundDrawList(g.CurrentWindow->Viewport)->AddRect(bb.Min, bb.Max, IM_COL32(255,0,255,255));

        const ImGuiDockNodeFlags merged_flags = child_0->MergedFlags | child_1->MergedFlags; // Merged flags for BOTH childs
        const ImGuiDockNodeFlags no_resize_axis_flag = (axis == ImGuiAxis_X) ? ImGuiDockNodeFlags_NoResizeX : ImGuiDockNodeFlags_NoResizeY;
        if ((merged_flags & ImGuiDockNodeFlags_NoResize) || (merged_flags & no_resize_axis_flag))
        {
            ImGuiWindow* window = g.CurrentWindow;
            window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Separator), g.Style.FrameRounding);
        }
        else
        {
            //bb.Min[axis] += 1; // Display a little inward so highlight doesn't connect with nearby tabs on the neighbor node.
            //bb.Max[axis] -= 1;
            PushID(node->ID);

            // Find resizing limits by gathering list of nodes that are touching the splitter line.
            ImVector<ImGuiDockNode*> touching_nodes[2];
            float min_size = g.Style.WindowMinSize[axis];
            float resize_limits[2];
            resize_limits[0] = node->ChildNodes[0]->Pos[axis] + min_size;
            resize_limits[1] = node->ChildNodes[1]->Pos[axis] + node->ChildNodes[1]->Size[axis] - min_size;

            ImGuiID splitter_id = GetID("##Splitter");
            if (g.ActiveId == splitter_id) // Only process when splitter is active
            {
                DockNodeTreeUpdateSplitterFindTouchingNode(child_0, axis, 1, &touching_nodes[0]);
                DockNodeTreeUpdateSplitterFindTouchingNode(child_1, axis, 0, &touching_nodes[1]);
                for (int touching_node_n = 0; touching_node_n < touching_nodes[0].Size; touching_node_n++)
                    resize_limits[0] = ImMax(resize_limits[0], touching_nodes[0][touching_node_n]->Rect().Min[axis] + min_size);
                for (int touching_node_n = 0; touching_node_n < touching_nodes[1].Size; touching_node_n++)
                    resize_limits[1] = ImMin(resize_limits[1], touching_nodes[1][touching_node_n]->Rect().Max[axis] - min_size);

                // [DEBUG] Render touching nodes & limits
                /*
                ImDrawList* draw_list = node->HostWindow ? GetForegroundDrawList(node->HostWindow) : GetForegroundDrawList(GetMainViewport());
                for (int n = 0; n < 2; n++)
                {
                    for (int touching_node_n = 0; touching_node_n < touching_nodes[n].Size; touching_node_n++)
                        draw_list->AddRect(touching_nodes[n][touching_node_n]->Pos, touching_nodes[n][touching_node_n]->Pos + touching_nodes[n][touching_node_n]->Size, IM_COL32(0, 255, 0, 255));
                    if (axis == ImGuiAxis_X)
                        draw_list->AddLine(ImVec2(resize_limits[n], node->ChildNodes[n]->Pos.y), ImVec2(resize_limits[n], node->ChildNodes[n]->Pos.y + node->ChildNodes[n]->Size.y), IM_COL32(255, 0, 255, 255), 3.0f);
                    else
                        draw_list->AddLine(ImVec2(node->ChildNodes[n]->Pos.x, resize_limits[n]), ImVec2(node->ChildNodes[n]->Pos.x + node->ChildNodes[n]->Size.x, resize_limits[n]), IM_COL32(255, 0, 255, 255), 3.0f);
                }
                */
            }

            // Use a short delay before highlighting the splitter (and changing the mouse cursor) in order for regular mouse movement to not highlight many splitters
            float cur_size_0 = child_0->Size[axis];
            float cur_size_1 = child_1->Size[axis];
            float min_size_0 = resize_limits[0] - child_0->Pos[axis];
            float min_size_1 = child_1->Pos[axis] + child_1->Size[axis] - resize_limits[1];
            if (SplitterBehavior(bb, GetID("##Splitter"), axis, &cur_size_0, &cur_size_1, min_size_0, min_size_1, WINDOWS_HOVER_PADDING, WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER))
            {
                if (touching_nodes[0].Size > 0 && touching_nodes[1].Size > 0)
                {
                    child_0->Size[axis] = child_0->SizeRef[axis] = cur_size_0;
                    child_1->Pos[axis] -= cur_size_1 - child_1->Size[axis];
                    child_1->Size[axis] = child_1->SizeRef[axis] = cur_size_1;

                    // Lock the size of every node that is a sibling of the node we are touching
                    // This might be less desirable if we can merge sibling of a same axis into the same parental level.
                    for (int side_n = 0; side_n < 2; side_n++)
                        for (int touching_node_n = 0; touching_node_n < touching_nodes[side_n].Size; touching_node_n++)
                        {
                            ImGuiDockNode* touching_node = touching_nodes[side_n][touching_node_n];
                            //ImDrawList* draw_list = node->HostWindow ? GetForegroundDrawList(node->HostWindow) : GetForegroundDrawList(GetMainViewport());
                            //draw_list->AddRect(touching_node->Pos, touching_node->Pos + touching_node->Size, IM_COL32(255, 128, 0, 255));
                            while (touching_node->ParentNode != node)
                            {
                                if (touching_node->ParentNode->SplitAxis == axis)
                                {
                                    // Mark other node so its size will be preserved during the upcoming call to DockNodeTreeUpdatePosSize().
                                    ImGuiDockNode* node_to_preserve = touching_node->ParentNode->ChildNodes[side_n];
                                    node_to_preserve->WantLockSizeOnce = true;
                                    //draw_list->AddRect(touching_node->Pos, touching_node->Rect().Max, IM_COL32(255, 0, 0, 255));
                                    //draw_list->AddRectFilled(node_to_preserve->Pos, node_to_preserve->Rect().Max, IM_COL32(0, 255, 0, 100));
                                }
                                touching_node = touching_node->ParentNode;
                            }
                        }

                    DockNodeTreeUpdatePosSize(child_0, child_0->Pos, child_0->Size);
                    DockNodeTreeUpdatePosSize(child_1, child_1->Pos, child_1->Size);
                    MarkIniSettingsDirty();
                }
            }
            PopID();
        }
    }

    if (child_0->IsVisible)
        DockNodeTreeUpdateSplitter(child_0);
    if (child_1->IsVisible)
        DockNodeTreeUpdateSplitter(child_1);
}